

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::D3MF::XmlSerializer::ReadMesh(XmlSerializer *this)

{
  bool bVar1;
  int iVar2;
  aiMesh *mesh;
  
  mesh = (aiMesh *)operator_new(0x520);
  mesh->mPrimitiveTypes = 0;
  mesh->mNumVertices = 0;
  mesh->mNumFaces = 0;
  memset(&mesh->mVertices,0,0xcc);
  mesh->mBones = (aiBone **)0x0;
  mesh->mMaterialIndex = 0;
  (mesh->mName).length = 0;
  (mesh->mName).data[0] = '\0';
  memset((mesh->mName).data + 1,0x1b,0x3ff);
  mesh->mNumAnimMeshes = 0;
  mesh->mAnimMeshes = (aiAnimMesh **)0x0;
  mesh->mMethod = 0;
  (mesh->mAABB).mMin.x = 0.0;
  (mesh->mAABB).mMin.y = 0.0;
  (mesh->mAABB).mMin.z = 0.0;
  (mesh->mAABB).mMax.x = 0.0;
  (mesh->mAABB).mMax.y = 0.0;
  (mesh->mAABB).mMax.z = 0.0;
  memset(mesh->mColors,0,0xa0);
  bVar1 = ReadToEndElement(this,(string *)XmlTag::mesh_abi_cxx11_);
  if (bVar1) {
    do {
      (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = std::__cxx11::string::compare(XmlTag::vertices_abi_cxx11_);
      if (iVar2 == 0) {
        ImportVertices(this,mesh);
      }
      else {
        (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = std::__cxx11::string::compare(XmlTag::triangles_abi_cxx11_);
        if (iVar2 == 0) {
          ImportTriangles(this,mesh);
        }
      }
      bVar1 = ReadToEndElement(this,(string *)XmlTag::mesh_abi_cxx11_);
    } while (bVar1);
  }
  return mesh;
}

Assistant:

aiMesh *ReadMesh() {
        aiMesh* mesh = new aiMesh();
        while(ReadToEndElement(D3MF::XmlTag::mesh)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertices) {
                ImportVertices(mesh);
            } else if(xmlReader->getNodeName() == D3MF::XmlTag::triangles) {
                ImportTriangles(mesh);
            }
        }

        return mesh;
    }